

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseImportModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  TokenType TVar2;
  Result RVar3;
  TagImport *this_00;
  _func_int **pp_Var4;
  pointer *__ptr;
  long *plVar5;
  long lVar6;
  string_view name_00;
  string name;
  Location loc;
  string field_name;
  string module_name;
  undefined1 local_128 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [32];
  long *local_d8 [2];
  long local_c8 [2];
  TagImport *local_b8;
  char *pcStack_b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a8;
  long lStack_a0;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_f8,this);
  local_a8.offset = local_f8._16_8_;
  lStack_a0 = local_f8._24_8_;
  local_b8 = (TagImport *)local_f8._0_8_;
  pcStack_b0 = (char *)local_f8._8_8_;
  CheckImportOrdering(this,module);
  RVar1 = Expect(this,Import);
  RVar3.enum_ = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._8_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  local_88._M_allocated_capacity = (size_type)&local_78;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  RVar1 = ParseQuotedText(this,&local_68,true);
  if (RVar1.enum_ == Error) goto LAB_0015b81b;
  RVar3.enum_ = Error;
  RVar1 = ParseQuotedText(this,(string *)&local_88,true);
  if ((RVar1.enum_ == Error) || (RVar1 = Expect(this,Lpar), RVar1.enum_ == Error))
  goto LAB_0015b81b;
  local_128._16_8_ = &local_108;
  local_128._24_8_ = 0;
  local_108._M_local_buf[0] = '\0';
  TVar2 = Peek(this,0);
  if ((int)TVar2 < 0x1f) {
    if (TVar2 == Tag) {
      Consume((Token *)local_f8,this);
      ParseBindVarOpt(this,(string *)(local_128 + 0x10));
      this_00 = (TagImport *)operator_new(0xf0);
      name_00._M_str = (char *)local_128._16_8_;
      name_00._M_len = local_128._24_8_;
      TagImport::TagImport(this_00,name_00);
      RVar1 = ParseTypeUseOpt(this,&(this_00->tag).decl);
      if (((RVar1.enum_ == Error) ||
          (RVar1 = ParseUnboundFuncSignature(this,&(this_00->tag).decl.sig), RVar1.enum_ == Error))
         || (RVar1 = Expect(this,Rpar), RVar1.enum_ == Error)) {
        pp_Var4 = (this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import;
        goto LAB_0015b7f7;
      }
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           operator_new(0x48);
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename._M_len =
           (size_t)local_b8;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.filename._M_str =
           pcStack_b0;
      (((ImportModuleField *)
       local_90._M_t.
       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
      super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.field_1.field_1.offset
           = local_a8.offset;
      *(long *)((long)&(((ImportModuleField *)
                        local_90._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                       super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.loc.
                       field_1 + 8) = lStack_a0;
LAB_0015b932:
      *(undefined4 *)
       ((long)&((ImportModuleField *)
               local_90._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
               super_ModuleFieldMixin<(wabt::ModuleFieldType)2> + 0x38) = 2;
      *(undefined ***)
       &((ImportModuleField *)
        local_90._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
        super_ModuleFieldMixin<(wabt::ModuleFieldType)2> = &PTR__ImportModuleField_001dd5f8;
      ((ImportModuleField *)
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->import =
           (unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>)this_00;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name);
      std::__cxx11::string::_M_assign
                ((string *)
                 (*(long *)&((ImportModuleField *)
                            local_90._M_t.
                            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl)->
                            import + 0x28));
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_90);
      if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
           )local_90._M_t.
            super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
          (ImportModuleField *)0x0) {
        (**(code **)(*(long *)local_90._M_t.
                              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl
                    + 8))();
      }
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
            )0x0;
      RVar1 = Expect(this,Rpar);
      RVar3.enum_ = (Enum)(RVar1.enum_ == Error);
    }
    else {
      if (TVar2 == Global) {
        Consume((Token *)local_f8,this);
        ParseBindVarOpt(this,(string *)(local_128 + 0x10));
        std::make_unique<wabt::GlobalImport,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
        RVar1 = ParseGlobalType(this,(Global *)(local_f8._0_8_ + 0x50));
LAB_0015b60a:
        this_00 = (TagImport *)local_f8._0_8_;
        if ((RVar1.enum_ == Error) ||
           (RVar1 = Expect(this,Rpar), this_00 = (TagImport *)local_f8._0_8_, RVar1.enum_ == Error))
        goto LAB_0015b76b;
        goto LAB_0015b629;
      }
LAB_0015b869:
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"an external kind","");
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 (string *)local_f8);
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      if ((TagImport *)local_f8._0_8_ != (TagImport *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
    }
  }
  else if (TVar2 == Memory) {
    Consume((Token *)local_f8,this);
    ParseBindVarOpt(this,(string *)(local_128 + 0x10));
    std::make_unique<wabt::MemoryImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    (((anon_union_16_2_ecfd7102_for_Location_1 *)(local_f8._0_8_ + 0x88))->field_0).line = 0x10000;
    RVar1 = ParseLimitsIndex(this,(Limits *)(local_f8._0_8_ + 0x70));
    if ((((RVar1.enum_ != Error) &&
         (RVar1 = ParseLimits(this,(Limits *)(local_f8._0_8_ + 0x70)), RVar1.enum_ != Error)) &&
        (RVar1 = ParsePageSize(this,(uint32_t *)(local_f8._0_8_ + 0x88)), RVar1.enum_ != Error)) &&
       (RVar1 = Expect(this,Rpar), RVar1.enum_ != Error)) {
LAB_0015b629:
      local_90._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
           operator_new(0x48);
      local_128._0_8_ = local_f8._0_8_;
LAB_0015b63b:
      *(long *)((long)local_90._M_t.
                      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) = 0
      ;
      *(long *)((long)local_90._M_t.
                      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10)
           = 0;
      *(size_t *)
       ((long)local_90._M_t.
              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28) =
           local_a8.offset;
      *(long *)((long)local_90._M_t.
                      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30)
           = lStack_a0;
      *(TagImport **)
       ((long)local_90._M_t.
              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) =
           local_b8;
      *(char **)((long)local_90._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20)
           = pcStack_b0;
      this_00 = (TagImport *)local_128._0_8_;
      goto LAB_0015b932;
    }
    if ((TagImport *)local_f8._0_8_ != (TagImport *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
    RVar3.enum_ = Error;
  }
  else {
    if (TVar2 == Table) {
      Consume((Token *)local_f8,this);
      ParseBindVarOpt(this,(string *)(local_128 + 0x10));
      std::make_unique<wabt::TableImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      RVar1 = ParseLimitsIndex(this,(Limits *)(local_f8._0_8_ + 0x70));
      this_00 = (TagImport *)local_f8._0_8_;
      if ((RVar1.enum_ != Error) &&
         (RVar1 = ParseLimits(this,(Limits *)(local_f8._0_8_ + 0x70)),
         this_00 = (TagImport *)local_f8._0_8_, RVar1.enum_ != Error)) {
        RVar1 = ParseRefType(this,(Type *)(local_f8._0_8_ + 0x88));
        goto LAB_0015b60a;
      }
    }
    else {
      if (TVar2 != First_RefKind) goto LAB_0015b869;
      Consume((Token *)local_f8,this);
      ParseBindVarOpt(this,(string *)(local_128 + 0x10));
      std::make_unique<wabt::FuncImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
      RVar1 = ParseTypeUseOpt(this,(FuncDeclaration *)(local_128._0_8_ + 0x70));
      this_00 = (TagImport *)local_128._0_8_;
      if ((RVar1.enum_ != Error) &&
         (RVar1 = ParseFuncSignature(this,(FuncSignature *)(local_128._0_8_ + 0xc0),
                                     (BindingHash *)(local_128._0_8_ + 0x108)),
         this_00 = (TagImport *)local_128._0_8_, RVar1.enum_ != Error)) {
        local_f8._0_8_ = local_f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"param","");
        plVar5 = local_c8;
        local_d8[0] = plVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"result","");
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   local_f8,&local_b8);
        local_128._12_4_ =
             ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_48,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        lVar6 = -0x40;
        do {
          if (plVar5 != (long *)plVar5[-2]) {
            operator_delete((long *)plVar5[-2],*plVar5 + 1);
          }
          plVar5 = plVar5 + -4;
          lVar6 = lVar6 + 0x20;
        } while (lVar6 != 0);
        this_00 = (TagImport *)local_128._0_8_;
        if ((local_128._12_4_ != Error) &&
           (RVar1 = Expect(this,Rpar), this_00 = (TagImport *)local_128._0_8_, RVar1.enum_ != Error)
           ) {
          local_90._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
               (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
               operator_new(0x48);
          goto LAB_0015b63b;
        }
      }
    }
LAB_0015b76b:
    if (this_00 != (TagImport *)0x0) {
      pp_Var4 = (this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import;
LAB_0015b7f7:
      (*pp_Var4[1])(this_00);
    }
    RVar3.enum_ = Error;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._16_8_ != &local_108) {
    operator_delete((void *)local_128._16_8_,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
LAB_0015b81b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    operator_delete((void *)local_88._M_allocated_capacity,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseImportModuleField(Module* module) {
  WABT_TRACE(ParseImportModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  CheckImportOrdering(module);
  EXPECT(Import);
  std::string module_name;
  std::string field_name;
  CHECK_RESULT(ParseQuotedText(&module_name));
  CHECK_RESULT(ParseQuotedText(&field_name));
  EXPECT(Lpar);

  std::unique_ptr<ImportModuleField> field;
  std::string name;

  switch (Peek()) {
    case TokenType::Func: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<FuncImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->func.decl));
      CHECK_RESULT(
          ParseFuncSignature(&import->func.decl.sig, &import->func.bindings));
      CHECK_RESULT(ErrorIfLpar({"param", "result"}));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Table: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<TableImport>(name);
      CHECK_RESULT(ParseLimitsIndex(&import->table.elem_limits));
      CHECK_RESULT(ParseLimits(&import->table.elem_limits));
      CHECK_RESULT(ParseRefType(&import->table.elem_type));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Memory: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<MemoryImport>(name);
      import->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
      CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
      CHECK_RESULT(ParseLimits(&import->memory.page_limits));
      CHECK_RESULT(ParsePageSize(&import->memory.page_size));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Global: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<GlobalImport>(name);
      CHECK_RESULT(ParseGlobalType(&import->global));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Tag: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<TagImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->tag.decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&import->tag.decl.sig));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    default:
      return ErrorExpected({"an external kind"});
  }

  field->import->module_name = module_name;
  field->import->field_name = field_name;

  module->AppendField(std::move(field));
  EXPECT(Rpar);
  return Result::Ok;
}